

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *sock,address *ip,
          ip_source_t source_type,address *source)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  element_type *this_00;
  element_type *this_01;
  endpoint *ep;
  address *addr;
  undefined1 auVar7 [16];
  undefined8 local_100;
  shared_ptr<libtorrent::aux::listen_socket_t> local_f0;
  listen_socket_handle local_e0;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_d0;
  shared_ptr<libtorrent::aux::torrent> *t;
  iterator __end2;
  iterator __begin2;
  torrent_list<libtorrent::aux::torrent> *__range2;
  string local_80;
  byte local_59;
  string local_58;
  uchar local_31;
  address *local_30;
  address *source_local;
  address *ip_local;
  shared_ptr<libtorrent::aux::listen_socket_t> *sock_local;
  session_impl *this_local;
  ip_source_t source_type_local;
  
  local_30 = source;
  source_local = ip;
  ip_local = (address *)sock;
  sock_local = (shared_ptr<libtorrent::aux::listen_socket_t> *)this;
  this_local._7_1_ = source_type.m_val;
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)sock);
  local_31 = this_local._7_1_;
  bVar1 = ip_voter::cast_vote(&peVar3->external_address,source_local,this_local._7_1_,local_30);
  if (bVar1) {
    bVar1 = should_log(this);
    if (bVar1) {
      ::std::
      __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)ip_local);
      uVar4 = ::std::__cxx11::string::empty();
      local_59 = 0;
      if ((uVar4 & 1) == 0) {
        ::std::
        __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)ip_local);
        auVar7 = ::std::__cxx11::string::c_str();
      }
      else {
        peVar3 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ip_local);
        print_endpoint_abi_cxx11_(&local_58,(aux *)&peVar3->local_endpoint,ep);
        local_59 = 1;
        auVar7 = ::std::__cxx11::string::c_str();
      }
      local_100 = auVar7._0_8_;
      print_address_abi_cxx11_(&local_80,(aux *)source_local,auVar7._8_8_);
      uVar5 = ::std::__cxx11::string::c_str();
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                        ((bitfield_flag *)((long)&this_local + 7));
      print_address_abi_cxx11_((string *)&__range2,(aux *)local_30,addr);
      uVar6 = ::std::__cxx11::string::c_str();
      session_log(this,"external address updated for %s [ new-ip: %s type: %d last-voter: %s ]",
                  local_100,uVar5,(ulong)bVar2,uVar6);
      ::std::__cxx11::string::~string((string *)&__range2);
      ::std::__cxx11::string::~string((string *)&local_80);
      if ((local_59 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_58);
      }
    }
    bVar1 = alert_manager::should_post<libtorrent::external_ip_alert>(&this->m_alerts);
    if (bVar1) {
      alert_manager::emplace_alert<libtorrent::external_ip_alert,boost::asio::ip::address_const&>
                (&this->m_alerts,source_local);
    }
    __end2 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    t = (shared_ptr<libtorrent::aux::torrent> *)
        torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                       *)&t), bVar1) {
      local_d0 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                    ::operator*(&__end2);
      this_00 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(local_d0);
      torrent::new_external_ip(this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end2);
    }
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
    if (bVar1) {
      this_01 = ::std::
                __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_dht);
      ::std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr
                (&local_f0,(shared_ptr<libtorrent::aux::listen_socket_t> *)ip_local);
      listen_socket_handle::listen_socket_handle(&local_e0,&local_f0);
      libtorrent::dht::dht_tracker::update_node_id(this_01,&local_e0);
      listen_socket_handle::~listen_socket_handle(&local_e0);
      ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr(&local_f0);
    }
  }
  return;
}

Assistant:

void session_impl::set_external_address(std::shared_ptr<listen_socket_t> const& sock
		, address const& ip, ip_source_t const source_type, address const& source)
	{
		if (!sock->external_address.cast_vote(ip, source_type, source)) return;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("external address updated for %s [ new-ip: %s type: %d last-voter: %s ]"
				, sock->device.empty() ? print_endpoint(sock->local_endpoint).c_str() : sock->device.c_str()
				, print_address(ip).c_str()
				, static_cast<std::uint8_t>(source_type)
				, print_address(source).c_str());
		}
#endif

		if (m_alerts.should_post<external_ip_alert>())
			m_alerts.emplace_alert<external_ip_alert>(ip);

		for (auto const& t : m_torrents)
		{
			t->new_external_ip();
		}

		// since we have a new external IP now, we need to
		// restart the DHT with a new node ID

#ifndef TORRENT_DISABLE_DHT
		if (m_dht) m_dht->update_node_id(sock);
#endif
	}